

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultGif.h
# Opt level: O2

void __thiscall TgBot::InlineQueryResultGif::InlineQueryResultGif(InlineQueryResultGif *this)

{
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultGif_002cf518;
  (this->gifUrl)._M_dataplus._M_p = (pointer)&(this->gifUrl).field_2;
  (this->gifUrl)._M_string_length = 0;
  (this->gifUrl).field_2._M_local_buf[0] = '\0';
  (this->thumbUrl)._M_dataplus._M_p = (pointer)&(this->thumbUrl).field_2;
  (this->thumbUrl)._M_string_length = 0;
  (this->thumbUrl).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&(this->super_InlineQueryResult).type);
  this->gifWidth = 0;
  this->gifHeight = 0;
  return;
}

Assistant:

InlineQueryResultGif() {
        this->type = TYPE;
        this->gifWidth = 0;
        this->gifHeight = 0;
    }